

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O0

void NoopOAATReadHash(void *key,int len,uint32_t seed,void *out)

{
  uint8_t *end;
  uint8_t *data;
  uint32_t h;
  void *out_local;
  uint32_t seed_local;
  int len_local;
  void *key_local;
  
  h = seed;
  for (data = (uint8_t *)key; data < (uint8_t *)((long)key + (long)len); data = data + 1) {
    h = (uint32_t)*data;
  }
  *(uint32_t *)out = h;
  return;
}

Assistant:

void
NoopOAATReadHash(const void *key, int len, uint32_t seed, void *out)
{
  uint32_t	 h = seed;
  const uint8_t *data = (const uint8_t *)key;
  const uint8_t *const end = &data[len];

  while (data < end) {
    h = *data++;
  }
  *(uint32_t *) out = h;
}